

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O2

void GrisuRound(char *buffer,int len,uint64_t delta,uint64_t rest,uint64_t ten_kappa,uint64_t wp_w)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = delta - rest;
  uVar2 = wp_w - rest;
  for (; ((rest < wp_w && (bVar3 = ten_kappa <= uVar1, uVar1 = uVar1 - ten_kappa, bVar3)) &&
         ((rest + ten_kappa < wp_w || (rest + (ten_kappa - wp_w) < uVar2))));
      uVar2 = uVar2 - ten_kappa) {
    buffer[(long)len + -1] = buffer[(long)len + -1] + -1;
    rest = rest + ten_kappa;
  }
  return;
}

Assistant:

inline void GrisuRound(char* buffer, int len, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t wp_w) {
	while (rest < wp_w && delta - rest >= ten_kappa &&
		   (rest + ten_kappa < wp_w ||  /// closer
			wp_w - rest > rest + ten_kappa - wp_w)) {
		buffer[len - 1]--;
		rest += ten_kappa;
	}
}